

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::internal::AddDescriptors(DescriptorTable *table)

{
  int i;
  long lVar1;
  
  if (*table->is_initialized != false) {
    return;
  }
  *table->is_initialized = true;
  for (lVar1 = 0; lVar1 < table->num_sccs; lVar1 = lVar1 + 1) {
    InitSCC(table->init_default_instances[lVar1]);
  }
  for (lVar1 = 0; lVar1 < table->num_deps; lVar1 = lVar1 + 1) {
    if (table->deps[lVar1] != (DescriptorTable *)0x0) {
      AddDescriptors(table->deps[lVar1]);
    }
  }
  DescriptorPool::InternalAddGeneratedFile(table->descriptor,table->size);
  MessageFactory::InternalRegisterGeneratedFile(table);
  return;
}

Assistant:

void AddDescriptors(const DescriptorTable* table) {
  // AddDescriptors is not thread safe. Callers need to ensure calls are
  // properly serialized. This function is only called pre-main by global
  // descriptors and we can assume single threaded access or it's called
  // by AssignDescriptorImpl which uses a mutex to sequence calls.
  if (*table->is_initialized) return;
  *table->is_initialized = true;
  AddDescriptorsImpl(table);
}